

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.cpp
# Opt level: O2

Constant *
spvtools::opt::anon_unknown_0::FoldClamp1
          (IRContext *context,Instruction *inst,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *constants)

{
  pointer ppCVar1;
  uint32_t uVar2;
  FeatureManager *pFVar3;
  Constant *pCVar4;
  uint32_t i;
  long lVar5;
  Constant *local_98;
  Constant *pCStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  BinaryScalarFoldingRule local_70;
  BinaryScalarFoldingRule local_50;
  
  if (inst->opcode_ != OpExtInst) {
    __assert_fail("inst->opcode() == spv::Op::OpExtInst && \"Expecting an extended instruction.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp"
                  ,0x5ec,
                  "const analysis::Constant *spvtools::opt::(anonymous namespace)::FoldClamp1(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  uVar2 = Instruction::GetSingleWordInOperand(inst,0);
  pFVar3 = IRContext::get_feature_mgr(context);
  if (uVar2 != pFVar3->extinst_importid_GLSLstd450_) {
    __assert_fail("inst->GetSingleWordInOperand(0) == context->get_feature_mgr()->GetExtInstImportId_GLSLstd450() && \"Expecting a GLSLstd450 extended instruction.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp"
                  ,0x5ef,
                  "const analysis::Constant *spvtools::opt::(anonymous namespace)::FoldClamp1(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  lVar5 = 1;
  while (lVar5 != 4) {
    ppCVar1 = (constants->
              super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
              )._M_impl.super__Vector_impl_data._M_start + lVar5;
    lVar5 = lVar5 + 1;
    if (*ppCVar1 == (Constant *)0x0) {
      return (Constant *)0x0;
    }
  }
  local_50.super__Function_base._M_functor._8_8_ = 0;
  local_50.super__Function_base._M_functor._M_unused._M_object = FoldMax;
  local_50._M_invoker =
       std::
       _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
       ::_M_invoke;
  local_50.super__Function_base._M_manager =
       std::
       _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
       ::_M_manager;
  uVar2 = Instruction::type_id(inst);
  ppCVar1 = (constants->
            super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_98 = ppCVar1[1];
  pCStack_90 = ppCVar1[2];
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  std::
  vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
  ::_M_range_initialize<spvtools::opt::analysis::Constant_const*const*>
            ((vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
              *)&local_88,&local_98);
  pCVar4 = FoldFPBinaryOp(&local_50,uVar2,
                          (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                           *)&local_88,context);
  std::
  _Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  ::~_Vector_base((_Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                   *)&local_88);
  if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_50.super__Function_base._M_manager)
              ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
  }
  if (pCVar4 != (Constant *)0x0) {
    local_70.super__Function_base._M_functor._8_8_ = 0;
    local_70.super__Function_base._M_functor._M_unused._M_object = FoldMin;
    local_70._M_invoker =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
         ::_M_invoke;
    local_70.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
         ::_M_manager;
    uVar2 = Instruction::type_id(inst);
    pCStack_90 = (constants->
                 super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                 )._M_impl.super__Vector_impl_data._M_start[3];
    local_88 = 0;
    uStack_80 = 0;
    local_78 = 0;
    local_98 = pCVar4;
    std::
    vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
    ::_M_range_initialize<spvtools::opt::analysis::Constant_const*const*>
              ((vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>
                *)&local_88,&local_98);
    pCVar4 = FoldFPBinaryOp(&local_70,uVar2,
                            (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                             *)&local_88,context);
    std::
    _Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
    ::~_Vector_base((_Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                     *)&local_88);
    if (local_70.super__Function_base._M_manager == (_Manager_type)0x0) {
      return pCVar4;
    }
    (*local_70.super__Function_base._M_manager)
              ((_Any_data *)&local_70,(_Any_data *)&local_70,__destroy_functor);
    return pCVar4;
  }
  return (Constant *)0x0;
}

Assistant:

const analysis::Constant* FoldClamp1(
    IRContext* context, Instruction* inst,
    const std::vector<const analysis::Constant*>& constants) {
  assert(inst->opcode() == spv::Op::OpExtInst &&
         "Expecting an extended instruction.");
  assert(inst->GetSingleWordInOperand(0) ==
             context->get_feature_mgr()->GetExtInstImportId_GLSLstd450() &&
         "Expecting a GLSLstd450 extended instruction.");

  // Make sure all Clamp operands are constants.
  for (uint32_t i = 1; i < 4; i++) {
    if (constants[i] == nullptr) {
      return nullptr;
    }
  }

  const analysis::Constant* temp = FoldFPBinaryOp(
      FoldMax, inst->type_id(), {constants[1], constants[2]}, context);
  if (temp == nullptr) {
    return nullptr;
  }
  return FoldFPBinaryOp(FoldMin, inst->type_id(), {temp, constants[3]},
                        context);
}